

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  bool enabled_local;
  ImGuiItemFlags option_local;
  
  pIVar1 = GetCurrentWindow();
  if (enabled) {
    (pIVar1->DC).ItemFlags = option | (pIVar1->DC).ItemFlags;
  }
  else {
    (pIVar1->DC).ItemFlags = (option ^ 0xffffffffU) & (pIVar1->DC).ItemFlags;
  }
  ImVector<int>::push_back(&(pIVar1->DC).ItemFlagsStack,&(pIVar1->DC).ItemFlags);
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (enabled)
        window->DC.ItemFlags |= option;
    else
        window->DC.ItemFlags &= ~option;
    window->DC.ItemFlagsStack.push_back(window->DC.ItemFlags);
}